

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O0

void __thiscall ncnn::ParamDict::set(ParamDict *this,int id,Mat *v)

{
  int in_ESI;
  Mat *in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  *(undefined4 *)((long)in_RDI + (long)in_ESI * 0x40 + 0x10) = 1;
  Mat::operator=(in_RDI,(Mat *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return;
}

Assistant:

void ParamDict::set(int id, const Mat& v)
{
    params[id].loaded = 1;
    params[id].v = v;
}